

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::Address::Set(Error *__return_storage_ptr__,Address *this,ByteArray *aRawAddr)

{
  char cVar1;
  long lVar2;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  lVar2 = (long)(aRawAddr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(aRawAddr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
  if ((lVar2 == 4) || (lVar2 == 0x10)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mBytes,aRawAddr);
  }
  else {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "IP address must has length of 4(IPv4) or 16(IPv6)";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x31;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    from = "IP address must has length of 4(IPv4) or 16(IPv6)";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_00227e22;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_58);
    }
LAB_00227e22:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"IP address must has length of 4(IPv4) or 16(IPv6)",
               (string_view)ZEXT816(0x31),args);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
    Error::operator=(__return_storage_ptr__,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const ByteArray &aRawAddr)
{
    Error error;

    if (aRawAddr.size() != kIpv4Size && aRawAddr.size() != kIpv6Size)
    {
        ExitNow(error = ERROR_INVALID_ARGS("IP address must has length of 4(IPv4) or 16(IPv6)"));
    }

    mBytes = aRawAddr;

exit:
    return error;
}